

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.h
# Opt level: O1

void __thiscall HighsLp::HighsLp(HighsLp *this,HighsLp *param_1)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t sVar5;
  HighsInt HVar6;
  bool bVar7;
  undefined3 uVar8;
  HighsInt HVar9;
  undefined2 uVar10;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>_>_>
  local_38;
  
  HVar6 = param_1->num_row_;
  this->num_col_ = param_1->num_col_;
  this->num_row_ = HVar6;
  std::vector<double,_std::allocator<double>_>::vector(&this->col_cost_,&param_1->col_cost_);
  std::vector<double,_std::allocator<double>_>::vector(&this->col_lower_,&param_1->col_lower_);
  std::vector<double,_std::allocator<double>_>::vector(&this->col_upper_,&param_1->col_upper_);
  std::vector<double,_std::allocator<double>_>::vector(&this->row_lower_,&param_1->row_lower_);
  std::vector<double,_std::allocator<double>_>::vector(&this->row_upper_,&param_1->row_upper_);
  (this->a_matrix_).num_row_ = (param_1->a_matrix_).num_row_;
  HVar6 = (param_1->a_matrix_).num_col_;
  (this->a_matrix_).format_ = (param_1->a_matrix_).format_;
  (this->a_matrix_).num_col_ = HVar6;
  std::vector<int,_std::allocator<int>_>::vector
            (&(this->a_matrix_).start_,&(param_1->a_matrix_).start_);
  std::vector<int,_std::allocator<int>_>::vector
            (&(this->a_matrix_).p_end_,&(param_1->a_matrix_).p_end_);
  std::vector<int,_std::allocator<int>_>::vector
            (&(this->a_matrix_).index_,&(param_1->a_matrix_).index_);
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->a_matrix_).value_,&(param_1->a_matrix_).value_);
  uVar2 = *(undefined4 *)&param_1->field_0xf4;
  uVar3 = *(undefined4 *)&param_1->offset_;
  uVar4 = *(undefined4 *)((long)&param_1->offset_ + 4);
  this->sense_ = param_1->sense_;
  *(undefined4 *)&this->field_0xf4 = uVar2;
  *(undefined4 *)&this->offset_ = uVar3;
  *(undefined4 *)((long)&this->offset_ + 4) = uVar4;
  (this->model_name_)._M_dataplus._M_p = (pointer)&(this->model_name_).field_2;
  pcVar1 = (param_1->model_name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->model_name_,pcVar1,pcVar1 + (param_1->model_name_)._M_string_length);
  (this->objective_name_)._M_dataplus._M_p = (pointer)&(this->objective_name_).field_2;
  pcVar1 = (param_1->objective_name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->objective_name_,pcVar1,
             pcVar1 + (param_1->objective_name_)._M_string_length);
  HVar6 = param_1->new_row_name_ix_;
  this->new_col_name_ix_ = param_1->new_col_name_ix_;
  this->new_row_name_ix_ = HVar6;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->col_names_,&param_1->col_names_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->row_names_,&param_1->row_names_);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
            (&this->integrality_,&param_1->integrality_);
  local_38._M_h = (__hashtable_alloc *)&this->col_hash_;
  (this->col_hash_).name2index._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->col_hash_).name2index._M_h._M_bucket_count =
       (param_1->col_hash_).name2index._M_h._M_bucket_count;
  (this->col_hash_).name2index._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->col_hash_).name2index._M_h._M_element_count =
       (param_1->col_hash_).name2index._M_h._M_element_count;
  uVar2 = *(undefined4 *)&(param_1->col_hash_).name2index._M_h._M_rehash_policy.field_0x4;
  sVar5 = (param_1->col_hash_).name2index._M_h._M_rehash_policy._M_next_resize;
  (this->col_hash_).name2index._M_h._M_rehash_policy._M_max_load_factor =
       (param_1->col_hash_).name2index._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->col_hash_).name2index._M_h._M_rehash_policy.field_0x4 = uVar2;
  (this->col_hash_).name2index._M_h._M_rehash_policy._M_next_resize = sVar5;
  (this->col_hash_).name2index._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,int>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_38._M_h,
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)&param_1->col_hash_,&local_38);
  local_38._M_h = (__hashtable_alloc *)&this->row_hash_;
  (this->row_hash_).name2index._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->row_hash_).name2index._M_h._M_bucket_count =
       (param_1->row_hash_).name2index._M_h._M_bucket_count;
  (this->row_hash_).name2index._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->row_hash_).name2index._M_h._M_element_count =
       (param_1->row_hash_).name2index._M_h._M_element_count;
  uVar2 = *(undefined4 *)&(param_1->row_hash_).name2index._M_h._M_rehash_policy.field_0x4;
  sVar5 = (param_1->row_hash_).name2index._M_h._M_rehash_policy._M_next_resize;
  (this->row_hash_).name2index._M_h._M_rehash_policy._M_max_load_factor =
       (param_1->row_hash_).name2index._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->row_hash_).name2index._M_h._M_rehash_policy.field_0x4 = uVar2;
  (this->row_hash_).name2index._M_h._M_rehash_policy._M_next_resize = sVar5;
  (this->row_hash_).name2index._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,int>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_38._M_h,
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)&param_1->row_hash_,&local_38);
  HVar6 = param_1->user_cost_scale_;
  this->user_bound_scale_ = param_1->user_bound_scale_;
  this->user_cost_scale_ = HVar6;
  bVar7 = (param_1->scale_).has_scaling;
  uVar8 = *(undefined3 *)&(param_1->scale_).field_0x5;
  HVar6 = (param_1->scale_).num_col;
  HVar9 = (param_1->scale_).num_row;
  (this->scale_).strategy = (param_1->scale_).strategy;
  (this->scale_).has_scaling = bVar7;
  *(undefined3 *)&(this->scale_).field_0x5 = uVar8;
  (this->scale_).num_col = HVar6;
  (this->scale_).num_row = HVar9;
  (this->scale_).cost = (param_1->scale_).cost;
  std::vector<double,_std::allocator<double>_>::vector(&(this->scale_).col,&(param_1->scale_).col);
  std::vector<double,_std::allocator<double>_>::vector(&(this->scale_).row,&(param_1->scale_).row);
  this->has_infinite_cost_ = param_1->has_infinite_cost_;
  bVar7 = param_1->is_moved_;
  uVar10 = *(undefined2 *)&param_1->field_0x252;
  HVar6 = param_1->cost_row_location_;
  this->is_scaled_ = param_1->is_scaled_;
  this->is_moved_ = bVar7;
  *(undefined2 *)&this->field_0x252 = uVar10;
  this->cost_row_location_ = HVar6;
  HighsLpMods::HighsLpMods(&this->mods_,&param_1->mods_);
  return;
}

Assistant:

HighsLp() { clear(); }